

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O1

bool __thiscall
Process::Converter::redirect
          (Converter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"rsrc/C/",
                 (v->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  paVar1 = &local_60.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_60.field_2._M_allocated_capacity = *psVar7;
    local_60.field_2._8_8_ = plVar5[3];
    local_60._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar7;
    local_60._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_60._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Parsing::File::setPath(&this->_f,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar4 = access((this->_f)._path._M_dataplus._M_p,0);
  if (iVar4 == -1) {
    std::operator+(&local_40,"Missing file : ",&(this->_f)._path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_60.field_2._M_allocated_capacity = *psVar7;
      local_60.field_2._8_8_ = plVar5[3];
      local_60._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar7;
      local_60._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_60._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    error(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    pbVar2 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(v->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
    if (lVar6 == 2) {
      bVar3 = transcript(this,pbVar2 + 1);
    }
    else if (lVar6 == 3) {
      bVar3 = transcript(this,pbVar2 + 1,pbVar2 + 2);
    }
    else {
      transcript(this);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool Converter::redirect(const std::vector<std::string> &v)
    {
        _f.setPath("rsrc/C/" + v[0] + ".txt");
        if (!_f.isFile())
            return error("Missing file : " + _f.getPath() + " in rsrc!");

        if (v.size() == 3)
            return transcript(v[1], v[2]);
        else if (v.size() == 2)
            return transcript(v[1]);
        return transcript();
    }